

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_KillInSector(FParser *this)

{
  bool bVar1;
  int tag;
  AActor *target;
  TThinkerIterator<AActor> it;
  FName local_54;
  DAngle local_50;
  FThinkerIterator local_48;
  
  if (0 < this->t_argc) {
    FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
    tag = intvalue(this->t_argv);
    target = (AActor *)FThinkerIterator::Next(&local_48,false);
    if (target != (AActor *)0x0) {
      do {
        if (((target->flags3).Value & 0x2000) != 0) {
          bVar1 = FTagManager::SectorHasTag(&tagManager,target->Sector,tag);
          if (bVar1) {
            local_54.Index = 0xca;
            local_50.Degrees = 0.0;
            P_DamageMobj(target,(AActor *)0x0,(AActor *)0x0,1000000,&local_54,0,&local_50);
          }
        }
        target = (AActor *)FThinkerIterator::Next(&local_48,false);
      } while (target != (AActor *)0x0);
    }
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void  FParser::SF_KillInSector()
{
	if (CheckArgs(1))
	{
		TThinkerIterator<AActor> it;
		AActor * mo;
		int tag=intvalue(t_argv[0]);

		while ((mo=it.Next()))
		{
			if (mo->flags3&MF3_ISMONSTER && tagManager.SectorHasTag(mo->Sector, tag)) P_DamageMobj(mo, NULL, NULL, 1000000, NAME_Massacre);
		}
	}
}